

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

int Ssw_ManSweepBmcFilter(Ssw_Man_t *p,int TimeLimit)

{
  int iVar1;
  void *pvVar2;
  Ssw_Pars_t *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Aig_Man_t *pAVar8;
  Aig_Obj_t **ppAVar9;
  Aig_Obj_t *pAVar10;
  ulong uVar11;
  int f;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  long lVar14;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar15;
  char *format;
  uint uVar16;
  Aig_Man_t *p_00;
  ulong uVar17;
  Aig_Man_t *pAVar18;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    local_48 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar16 = p->pPars->nFramesK * p->pAig->vObjs->nSize;
  p_00 = (Aig_Man_t *)(ulong)uVar16;
  pAVar8 = Aig_ManStart(uVar16);
  p->pFrames = pAVar8;
  pAVar8 = p->pAig;
  if (0 < pAVar8->nRegs) {
    iVar5 = 0;
    do {
      uVar16 = pAVar8->nTruePis + iVar5;
      if (((int)uVar16 < 0) || (pAVar8->vCis->nSize <= (int)uVar16)) {
LAB_005eaff3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p_00 = (Aig_Man_t *)p->pFrames->pConst1;
      pAVar18 = (Aig_Man_t *)((ulong)p_00 ^ 1);
      if ((p->pPatWords[uVar16 >> 5] >> (uVar16 & 0x1f) & 1) != 0) {
        pAVar18 = p_00;
      }
      p->pNodeToFrames[(long)*(int *)((long)pAVar8->vCis->pArray[uVar16] + 0x24) * (long)p->nFrames]
           = (Aig_Obj_t *)pAVar18;
      iVar5 = iVar5 + 1;
      pAVar8 = p->pAig;
    } while (iVar5 < pAVar8->nRegs);
  }
  if (0 < p->pPars->nFramesK) {
    uVar17 = 0;
    do {
      iVar5 = p->nFrames;
      f = (int)uVar17;
      if (f == iVar5 + -1) {
        pVVar12 = pAVar8->vObjs;
        iVar4 = iVar5 * 2;
        ppAVar9 = (Aig_Obj_t **)calloc((long)(pVVar12->nSize * iVar4),8);
        if (0 < iVar5) {
          iVar6 = 0;
          do {
            if (0 < pVVar12->nSize) {
              lVar14 = 0;
              do {
                if (pVVar12->pArray[lVar14] != (void *)0x0) {
                  iVar1 = *(int *)((long)pVVar12->pArray[lVar14] + 0x24);
                  ppAVar9[iVar1 * iVar4 + iVar6] = p->pNodeToFrames[iVar1 * iVar5 + iVar6];
                  pVVar12 = pAVar8->vObjs;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < pVVar12->nSize);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != iVar5);
        }
        p_00 = (Aig_Man_t *)p->pNodeToFrames;
        iVar5 = iVar4;
        if (p_00 != (Aig_Man_t *)0x0) {
          free(p_00);
          pAVar8 = p->pAig;
          iVar5 = p->nFrames * 2;
        }
        p->pNodeToFrames = ppAVar9;
        p->nFrames = iVar5;
      }
      else {
        ppAVar9 = p->pNodeToFrames;
      }
      ppAVar9[iVar5 * pAVar8->pConst1->Id + f] = p->pFrames->pConst1;
      pAVar8 = p->pAig;
      if (0 < pAVar8->nTruePis) {
        lVar14 = 0;
        do {
          if (pAVar8->vCis->nSize <= lVar14) goto LAB_005eaff3;
          pvVar2 = pAVar8->vCis->pArray[lVar14];
          p_00 = p->pFrames;
          pAVar10 = Aig_ObjCreateCi(p_00);
          p->pNodeToFrames[*(int *)((long)pvVar2 + 0x24) * p->nFrames + f] = pAVar10;
          lVar14 = lVar14 + 1;
          pAVar8 = p->pAig;
        } while (lVar14 < pAVar8->nTruePis);
      }
      pVVar12 = pAVar8->vObjs;
      if (pVVar12->nSize < 1) {
        iVar5 = 0;
      }
      else {
        lVar14 = 0;
        do {
          pAVar10 = (Aig_Obj_t *)pVVar12->pArray[lVar14];
          if ((pAVar10 != (Aig_Obj_t *)0x0) &&
             (0xfffffffd < (*(uint *)&pAVar10->field_0x18 & 7) - 7)) {
            if (((ulong)pAVar10 & 1) != 0) goto LAB_005eb012;
            uVar11 = (ulong)pAVar10->pFanin0 & 0xfffffffffffffffe;
            if (uVar11 == 0) {
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar15 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar10->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar11 + 0x24) * p->nFrames + f]);
            }
            uVar11 = (ulong)pAVar10->pFanin1 & 0xfffffffffffffffe;
            if (uVar11 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar10->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar11 + 0x24) * p->nFrames + f]);
            }
            pAVar15 = Aig_And(p->pFrames,pAVar15,p1);
            p->pNodeToFrames[pAVar10->Id * p->nFrames + f] = pAVar15;
            p_00 = (Aig_Man_t *)p;
            iVar5 = Ssw_ManSweepNodeFilter(p,pAVar10,f);
            if (iVar5 != 0) break;
            pAVar8 = p->pAig;
          }
          lVar14 = lVar14 + 1;
          pVVar12 = pAVar8->vObjs;
        } while (lVar14 < pVVar12->nSize);
        iVar5 = (int)lVar14;
      }
      if (p->pPars->fVerbose != 0) {
        Abc_Print((int)p_00,"Frame %4d : ",uVar17);
        p_00 = (Aig_Man_t *)p->ppClasses;
        Ssw_ClassesPrint((Ssw_Cla_t *)p_00,0);
      }
      pSVar3 = p->pPars;
      pAVar8 = p->pAig;
      if (iVar5 < pAVar8->vObjs->nSize) {
        if (pSVar3->fVerbose == 0) {
          return 1;
        }
        uVar16 = pSVar3->nBTLimit;
        format = "Exceeded the resource limits (%d conflicts). Quitting...\n";
LAB_005eafd8:
        Abc_Print((int)p_00,format,(ulong)uVar16);
        return 1;
      }
      uVar16 = pSVar3->nFramesK;
      if (f == uVar16 - 1) {
        if (pSVar3->fVerbose == 0) {
          return 1;
        }
        format = "Exceeded the time frame limit (%d time frames). Quitting...\n";
        goto LAB_005eafd8;
      }
      if (TimeLimit != 0) {
        p_00 = (Aig_Man_t *)0x3;
        iVar5 = clock_gettime(3,&local_40);
        if (iVar5 < 0) {
          lVar14 = -1;
        }
        else {
          lVar14 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        if ((float)TimeLimit <= (float)(lVar14 + local_48) / 1e+06) {
          return 1;
        }
        pAVar8 = p->pAig;
      }
      pVVar12 = pAVar8->vCos;
      if (0 < pVVar12->nSize) {
        lVar14 = 0;
        do {
          pvVar2 = pVVar12->pArray[lVar14];
          if (((ulong)pvVar2 & 1) != 0) {
LAB_005eb012:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar17 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar10 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar10 = (Aig_Obj_t *)
                      ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar17 + 0x24) * p->nFrames + f]);
          }
          uVar16 = p->nFrames * *(int *)((long)pvVar2 + 0x24) + f;
          p_00 = (Aig_Man_t *)(ulong)uVar16;
          p->pNodeToFrames[(int)uVar16] = pAVar10;
          lVar14 = lVar14 + 1;
          pAVar8 = p->pAig;
          pVVar12 = pAVar8->vCos;
        } while (lVar14 < pVVar12->nSize);
      }
      uVar16 = f + 1;
      if (0 < pAVar8->nRegs) {
        iVar5 = 0;
        do {
          uVar7 = pAVar8->nTruePos + iVar5;
          if (((((int)uVar7 < 0) || (pAVar8->vCos->nSize <= (int)uVar7)) ||
              (uVar13 = pAVar8->nTruePis + iVar5, (int)uVar13 < 0)) ||
             (pAVar8->vCis->nSize <= (int)uVar13)) goto LAB_005eaff3;
          pAVar10 = p->pNodeToFrames
                    [*(int *)((long)pAVar8->vCos->pArray[uVar7] + 0x24) * p->nFrames + f];
          p->pNodeToFrames
          [(int)(p->nFrames * *(int *)((long)pAVar8->vCis->pArray[uVar13] + 0x24) + uVar16)] =
               pAVar10;
          p_00 = (Aig_Man_t *)p->pMSat;
          Ssw_CnfNodeAddToSolver
                    ((Ssw_Sat_t *)p_00,(Aig_Obj_t *)((ulong)pAVar10 & 0xfffffffffffffffe));
          iVar5 = iVar5 + 1;
          pAVar8 = p->pAig;
        } while (iVar5 < pAVar8->nRegs);
      }
      uVar17 = (ulong)uVar16;
    } while ((int)uVar16 < p->pPars->nFramesK);
  }
  return 1;
}

Assistant:

int Ssw_ManSweepBmcFilter( Ssw_Man_t * p, int TimeLimit )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int f, f1, i;
    abctime clkTotal = Abc_Clock();
    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i ) )
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst1(p->pFrames) );
//Abc_Print( 1, "1" );
        }
        else
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );
//Abc_Print( 1, "0" );
        }
    }
//Abc_Print( 1, "\n" );

    // sweep internal nodes
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // realloc mapping of timeframes
        if ( f == p->nFrames-1 )
        {
            Aig_Obj_t ** pNodeToFrames;
            pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * 2 * p->nFrames );
            for ( f1 = 0; f1 < p->nFrames; f1++ )
            {
                Aig_ManForEachObj( p->pAig, pObj, i )
                    pNodeToFrames[2*p->nFrames*pObj->Id + f1] = Ssw_ObjFrame( p, pObj, f1 );
            }
            ABC_FREE( p->pNodeToFrames );
            p->pNodeToFrames = pNodeToFrames;
            p->nFrames *= 2;
        }
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNodeFilter( p, pObj, f ) )
                break;
        }
        // printout
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d : ", f );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        if ( i < Vec_PtrSize(p->pAig->vObjs) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the resource limits (%d conflicts). Quitting...\n", p->pPars->nBTLimit );
            break;
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the time frame limit (%d time frames). Quitting...\n", p->pPars->nFramesK );
            break;
        }
        // check timeout
        if ( TimeLimit && ((float)TimeLimit <= (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC)) )
            break;
        // transfer latch input to the latch outputs 
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    // verify
//    Ssw_ClassesCheck( p->ppClasses );
    return 1;
}